

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.c
# Opt level: O1

nh_drawing_info * nh_get_drawing_info(void)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  nh_drawing_info *pnVar4;
  nh_symdef *pnVar5;
  size_t sVar6;
  char *__s;
  char *pcVar7;
  int *piVar8;
  long lVar9;
  permonst *ppVar10;
  ulong *puVar11;
  uchar *puVar12;
  char **ppcVar13;
  char buffer [41];
  ulong local_98;
  undefined6 uStack_90;
  undefined2 uStack_8a;
  undefined6 uStack_88;
  char local_68 [40];
  undefined1 local_40;
  
  pnVar4 = (nh_drawing_info *)xmalloc(0x90);
  pnVar4->num_bgelements = 0x30;
  pnVar4->bgelements = defsyms;
  pnVar4->num_traps = 0x18;
  pnVar4->num_objects = 0x21a;
  pnVar4->traps = trapsyms;
  pnVar5 = (nh_symdef *)xmalloc(0x3270);
  if (0 < pnVar4->num_objects) {
    puVar12 = &const_objects[0].oc_color;
    ppcVar13 = &obj_descr[0].oc_descr;
    piVar8 = &pnVar5->color;
    lVar9 = 0;
    do {
      bVar1 = puVar12[-2];
      ((nh_symdef *)(piVar8 + -4))->ch = ""[(char)bVar1];
      local_98 = local_98 & 0xffffffffffffff00;
      local_68[0] = '\0';
      local_40 = 0;
      puVar11 = (ulong *)((objdescr *)(ppcVar13 + -1))->oc_name;
      if (puVar11 == (ulong *)0x0) {
        unnamed_cnt[(char)bVar1] = unnamed_cnt[(char)bVar1] + 1;
        snprintf((char *)&local_98,0x28,"unnamed %d");
      }
      if (bVar1 == 0xd) {
        if ((*(ushort *)(puVar12 + -6) & 0x1f0) == 0x130) {
          snprintf((char *)&local_98,0x28,"%s glass gem",*ppcVar13);
        }
      }
      else if ((bVar1 == 5) && ((*(ushort *)(puVar12 + -6) & 0x1f0) == 0x120)) {
        local_98._0_1_ = 'f';
        local_98._1_1_ = 'a';
        local_98._2_1_ = 'k';
        local_98._3_1_ = 'e';
        local_98._4_1_ = ' ';
        local_98._5_1_ = 'a';
        local_98._6_1_ = 'm';
        local_98._7_1_ = 'u';
        uStack_90 = 0x666f2074656c;
        uStack_8a = 0x7920;
        uStack_88 = 0x726f646e65;
      }
      if ((char)local_98 != '\0') {
        puVar11 = &local_98;
      }
      pcVar7 = "%s";
      if ((byte)(bVar1 - 4) < 8) {
        pcVar7 = &DAT_002a8804 + *(int *)(&DAT_002a8804 + (ulong)(byte)(bVar1 - 4) * 4);
      }
      snprintf(local_68,0x28,pcVar7,puVar11);
      sVar6 = strlen(local_68);
      pcVar7 = (char *)xmalloc((int)sVar6 + 1);
      strcpy(pcVar7,local_68);
      *(char **)(piVar8 + -2) = pcVar7;
      *piVar8 = (uint)*puVar12;
      lVar9 = lVar9 + 1;
      piVar8 = piVar8 + 6;
      puVar12 = puVar12 + 0x28;
      ppcVar13 = ppcVar13 + 2;
    } while (lVar9 < pnVar4->num_objects);
  }
  pnVar5[0x214].ch = '0';
  pnVar4->objects = pnVar5;
  pnVar5 = (nh_symdef *)xmalloc(0x18);
  pnVar5->ch = 'I';
  pnVar5->color = 8;
  pnVar5->symname = "invisible monster";
  pnVar4->invis = pnVar5;
  pnVar4->num_monsters = 0x193;
  pnVar5 = (nh_symdef *)xmalloc(0x25c8);
  if (0 < pnVar4->num_monsters) {
    piVar8 = &pnVar5->color;
    ppVar10 = mons;
    lVar9 = 0;
    do {
      cVar2 = ppVar10->mlet;
      ((nh_symdef *)(piVar8 + -4))->ch = ""[cVar2];
      if ((long)cVar2 == 0x35) {
        pcVar7 = ppVar10->mname;
        iVar3 = strncmp(pcVar7,"were",4);
        if (iVar3 != 0) goto LAB_00189e07;
        sVar6 = strlen(pcVar7);
        __s = (char *)xmalloc((int)sVar6 + 7);
        sprintf(__s,"human %s",pcVar7);
      }
      else {
LAB_00189e07:
        __s = ppVar10->mname;
      }
      *(char **)(piVar8 + -2) = __s;
      *piVar8 = (uint)ppVar10->mcolor;
      lVar9 = lVar9 + 1;
      piVar8 = piVar8 + 6;
      ppVar10 = ppVar10 + 1;
    } while (lVar9 < pnVar4->num_monsters);
  }
  pnVar4->monsters = pnVar5;
  pnVar4->num_warnings = 6;
  pnVar4->warnings = warnsyms;
  pnVar4->num_expltypes = 7;
  pnVar4->num_zaptypes = 8;
  pnVar4->expltypes = expltypes;
  pnVar4->explsyms = explsyms;
  pnVar4->zaptypes = zaptypes;
  pnVar4->zapsyms = zapsyms;
  pnVar4->breathsyms = breathsyms;
  pnVar4->num_effects = 9;
  pnVar4->bg_feature_offset = 0x19;
  pnVar4->effects = effectsyms;
  pnVar4->swallowsyms = swallowsyms;
  return pnVar4;
}

Assistant:

struct nh_drawing_info *nh_get_drawing_info(void)
{
    int i;
    struct nh_symdef *tmp;
    struct nh_drawing_info *di = xmalloc(sizeof(struct nh_drawing_info));
    
    di->num_bgelements = SIZE(defsyms);
    di->bgelements = (struct nh_symdef *)defsyms;
    
    di->num_traps = SIZE(trapsyms);
    di->traps = (struct nh_symdef *)trapsyms;
    
    di->num_objects = NUM_OBJECTS;
    tmp = xmalloc(sizeof(struct nh_symdef) * di->num_objects);
    for (i = 0; i < di->num_objects; i++) {
	tmp[i].ch = def_oc_syms[(int)const_objects[i].oc_class];
	tmp[i].symname = make_object_name(i);
	tmp[i].color = const_objects[i].oc_color;
    }
    /* show boulders as '0' by default */
    tmp[BOULDER].ch = '0';
    di->objects = tmp;
    
    tmp = xmalloc(sizeof(struct nh_symdef));
    tmp->ch = DEF_INVISIBLE;
    tmp->color = NO_COLOR;
    tmp->symname = "invisible monster";
    di->invis = tmp;
    
    di->num_monsters = NUMMONS;
    tmp = xmalloc(sizeof(struct nh_symdef) * di->num_monsters);
    for (i = 0; i < di->num_monsters; i++) {
	tmp[i].ch = def_monsyms[(int)mons[i].mlet];
	tmp[i].symname = make_mon_name(i);
	tmp[i].color = mons[i].mcolor;
    }
    di->monsters = tmp;
    
    di->num_warnings = SIZE(warnsyms);
    di->warnings = (struct nh_symdef *)warnsyms;
    
    di->num_expltypes = SIZE(expltypes);
    di->expltypes = (struct nh_symdef *)expltypes;
    di->explsyms = (struct nh_symdef *)explsyms;
    
    di->num_zaptypes = SIZE(zaptypes);
    di->zaptypes = (struct nh_symdef *)zaptypes;
    di->zapsyms = (struct nh_symdef *)zapsyms;
    di->breathsyms = (struct nh_symdef *)breathsyms;
    
    di->num_effects = SIZE(effectsyms);
    di->effects = (struct nh_symdef *)effectsyms;
    
    di->swallowsyms = (struct nh_symdef *)swallowsyms;
    
    di->bg_feature_offset = DUNGEON_FEATURE_OFFSET;
    
    return di;
}